

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O1

exr_result_t
internal_exr_undo_zip
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  ulong out_bytes_avail;
  uint8_t *source;
  exr_result_t eVar1;
  uint64_t newsz;
  size_t actual_out_bytes;
  uint64_t local_38;
  
  newsz = uncompressed_size;
  if (uncompressed_size < comp_buf_size) {
    newsz = comp_buf_size;
  }
  eVar1 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,&decode->scratch_buffer_1,
                     &decode->scratch_alloc_size_1,newsz);
  if ((eVar1 == 0) &&
     (out_bytes_avail = decode->scratch_alloc_size_1, eVar1 = 3,
     uncompressed_size <= out_bytes_avail)) {
    source = (uint8_t *)decode->scratch_buffer_1;
    eVar1 = exr_uncompress_buffer(compressed_data,comp_buf_size,source,out_bytes_avail,&local_38);
    if ((eVar1 == 0) && (eVar1 = 0x17, local_38 == uncompressed_size)) {
      internal_zip_reconstruct_bytes((uint8_t *)uncompressed_data,source,local_38);
      eVar1 = 0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_zip (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    uint64_t scratchbufsz = uncompressed_size;
    if ( comp_buf_size > scratchbufsz )
        scratchbufsz = comp_buf_size;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        scratchbufsz);
    if (rv != EXR_ERR_SUCCESS) return rv;
    return undo_zip_impl (
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size,
        decode->scratch_buffer_1,
        decode->scratch_alloc_size_1);
}